

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomType.cpp
# Opt level: O2

bool __thiscall OpenMD::AtomType::isEAM(AtomType *this)

{
  bool bVar1;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"EAM",&local_31);
  bVar1 = hasProperty(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool AtomType::isEAM() { return hasProperty("EAM"); }